

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngset.c
# Opt level: O0

void png_set_iCCP(png_const_structrp png_ptr,png_inforp info_ptr,png_const_charp name,
                 int compression_type,png_const_bytep profile,png_uint_32 proflen)

{
  size_t sVar1;
  png_charp __dest;
  png_bytep __dest_00;
  size_t length;
  png_bytep new_iccp_profile;
  png_charp new_iccp_name;
  png_uint_32 proflen_local;
  png_const_bytep profile_local;
  int compression_type_local;
  png_const_charp name_local;
  png_inforp info_ptr_local;
  png_const_structrp png_ptr_local;
  
  if ((((png_ptr != (png_const_structrp)0x0) && (info_ptr != (png_inforp)0x0)) &&
      (name != (png_const_charp)0x0)) && (profile != (png_const_bytep)0x0)) {
    if (compression_type != 0) {
      png_app_error(png_ptr,"Invalid iCCP compression method");
    }
    sVar1 = strlen(name);
    __dest = (png_charp)png_malloc_warn(png_ptr,sVar1 + 1);
    if (__dest == (png_charp)0x0) {
      png_benign_error(png_ptr,"Insufficient memory to process iCCP chunk");
    }
    else {
      memcpy(__dest,name,sVar1 + 1);
      __dest_00 = (png_bytep)png_malloc_warn(png_ptr,(ulong)proflen);
      if (__dest_00 == (png_bytep)0x0) {
        png_free(png_ptr,__dest);
        png_benign_error(png_ptr,"Insufficient memory to process iCCP profile");
      }
      else {
        memcpy(__dest_00,profile,(ulong)proflen);
        png_free_data(png_ptr,info_ptr,0x10,0);
        info_ptr->iccp_proflen = proflen;
        info_ptr->iccp_name = __dest;
        info_ptr->iccp_profile = __dest_00;
        info_ptr->free_me = info_ptr->free_me | 0x10;
        info_ptr->valid = info_ptr->valid | 0x1000;
      }
    }
  }
  return;
}

Assistant:

void PNGAPI
png_set_iCCP(png_const_structrp png_ptr, png_inforp info_ptr,
    png_const_charp name, int compression_type,
    png_const_bytep profile, png_uint_32 proflen)
{
   png_charp new_iccp_name;
   png_bytep new_iccp_profile;
   size_t length;

   png_debug1(1, "in %s storage function", "iCCP");

   if (png_ptr == NULL || info_ptr == NULL || name == NULL || profile == NULL)
      return;

   if (compression_type != PNG_COMPRESSION_TYPE_BASE)
      png_app_error(png_ptr, "Invalid iCCP compression method");

   length = strlen(name)+1;
   new_iccp_name = png_voidcast(png_charp, png_malloc_warn(png_ptr, length));

   if (new_iccp_name == NULL)
   {
      png_benign_error(png_ptr, "Insufficient memory to process iCCP chunk");

      return;
   }

   memcpy(new_iccp_name, name, length);
   new_iccp_profile = png_voidcast(png_bytep,
       png_malloc_warn(png_ptr, proflen));

   if (new_iccp_profile == NULL)
   {
      png_free(png_ptr, new_iccp_name);
      png_benign_error(png_ptr,
          "Insufficient memory to process iCCP profile");

      return;
   }

   memcpy(new_iccp_profile, profile, proflen);

   png_free_data(png_ptr, info_ptr, PNG_FREE_ICCP, 0);

   info_ptr->iccp_proflen = proflen;
   info_ptr->iccp_name = new_iccp_name;
   info_ptr->iccp_profile = new_iccp_profile;
   info_ptr->free_me |= PNG_FREE_ICCP;
   info_ptr->valid |= PNG_INFO_iCCP;
}